

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O2

bool __thiscall RingBuffer<8192,_unsigned_int>::Read(RingBuffer<8192,_unsigned_int> *this,uint *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = this->readpos;
  iVar2 = this->writepos;
  if (iVar1 != iVar2) {
    iVar3 = 0;
    if (iVar1 != 0x1fff) {
      iVar3 = iVar1 + 1;
    }
    *val = this->buffer[iVar3];
    this->readpos = iVar3;
  }
  return iVar1 != iVar2;
}

Assistant:

inline bool Read(T& val)
    {
        int r = readpos;
        if (r == writepos)
            return false;
        r = (r == LENGTH - 1) ? 0 : (r + 1);
        val = buffer[r];
        readpos = r;
        return true;
    }